

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O3

Aig_Obj_t * Dar_RefactBuildGraph(Aig_Man_t *pAig,Vec_Ptr_t *vCut,Kit_Graph_t *pGraph)

{
  Kit_Node_t *pKVar1;
  Kit_Edge_t KVar2;
  Aig_Obj_t *pAVar3;
  long lVar4;
  undefined1 *puVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  if (pGraph->fConst == 0) {
    uVar6 = pGraph->nLeaves;
    if ((int)uVar6 < 1) {
      puVar5 = (undefined1 *)0x0;
    }
    else {
      lVar8 = 0;
      lVar9 = -0x18;
      do {
        lVar4 = lVar9;
        if (vCut->nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pKVar1 = pGraph->pNodes;
        *(void **)((long)&pKVar1[1].field_2 + lVar4) = vCut->pArray[lVar8];
        lVar8 = lVar8 + 1;
        uVar6 = pGraph->nLeaves;
        lVar9 = lVar4 + 0x18;
      } while (lVar8 < (int)uVar6);
      puVar5 = &pKVar1[1].eEdge0.field_0x0 + lVar4;
    }
    KVar2 = pGraph->eRoot;
    uVar7 = (uint)KVar2 >> 1 & 0x3fffffff;
    if (uVar7 < uVar6) {
      pAVar3 = (Aig_Obj_t *)((ulong)((uint)KVar2 & 1) ^ (ulong)pGraph->pNodes[uVar7].field_2.pFunc);
    }
    else {
      if ((int)uVar6 < pGraph->nSize) {
        uVar10 = (ulong)uVar6;
        lVar9 = uVar10 * 0x18 + 8;
        do {
          pKVar1 = pGraph->pNodes;
          uVar6 = *(uint *)((long)pKVar1 + lVar9 + -8);
          uVar7 = *(uint *)((long)pKVar1 + lVar9 + -4);
          pAVar3 = Aig_And(pAig,(Aig_Obj_t *)
                                ((ulong)(uVar6 & 1) ^
                                (ulong)pKVar1[uVar6 >> 1 & 0x3fffffff].field_2.pFunc),
                           (Aig_Obj_t *)
                           ((ulong)(uVar7 & 1) ^
                           (ulong)pKVar1[uVar7 >> 1 & 0x3fffffff].field_2.pFunc));
          *(Aig_Obj_t **)(&(pKVar1->eEdge0).field_0x0 + lVar9) = pAVar3;
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x18;
        } while ((long)uVar10 < (long)pGraph->nSize);
        KVar2 = pGraph->eRoot;
      }
      else {
        pAVar3 = *(Aig_Obj_t **)(puVar5 + 8);
      }
      pAVar3 = (Aig_Obj_t *)((ulong)((uint)KVar2 & 1) ^ (ulong)pAVar3);
    }
  }
  else {
    pAVar3 = (Aig_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pAig->pConst1);
  }
  return pAVar3;
}

Assistant:

Aig_Obj_t * Dar_RefactBuildGraph( Aig_Man_t * pAig, Vec_Ptr_t * vCut, Kit_Graph_t * pGraph )
{
    Aig_Obj_t * pAnd0, * pAnd1;
    Kit_Node_t * pNode = NULL;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Aig_NotCond( Aig_ManConst1(pAig), Kit_GraphIsComplement(pGraph) );
    // set the leaves
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Vec_PtrEntry(vCut, i);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Aig_NotCond( (Aig_Obj_t *)Kit_GraphVar(pGraph)->pFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
//printf( "Building (current number %d):\n", Aig_ManObjNumMax(pAig) );
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Aig_And( pAig, pAnd0, pAnd1 );
/*
printf( "Checking " );
Ref_ObjPrint( pAnd0 );
printf( " and " );
Ref_ObjPrint( pAnd1 );
printf( "  Result " );
Ref_ObjPrint( pNode->pFunc );
printf( "\n" );
*/
    }
    // complement the result if necessary
    return Aig_NotCond( (Aig_Obj_t *)pNode->pFunc, Kit_GraphIsComplement(pGraph) );
}